

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::error(string *message)

{
  ostream *poVar1;
  logic_error *this;
  string *in_RDI;
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[ERROR] ");
    poVar1 = std::operator<<(poVar1,in_RDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((options::errorsThrowExceptions & 1) != 0) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::logic_error::logic_error(this,local_28);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void error(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  if (options::errorsThrowExceptions) {
    throw std::logic_error(options::printPrefix + message);
  }
}